

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O3

void __thiscall Win32MakefileGenerator::writeIncPart(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *this_00;
  int *piVar1;
  QArrayData *pQVar2;
  ProStringList *pPVar3;
  QTextStream *pQVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  qsizetype local_98;
  QRegularExpression local_90 [8];
  QArrayData *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<(t,"INCPATH       = ");
  this_00 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_68,"INCLUDEPATH");
  pPVar3 = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,&local_68);
  piVar1 = (int *)CONCAT44(local_68.super_ProString.m_string.d.d._4_4_,
                           local_68.super_ProString.m_string.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)
                 CONCAT44(local_68.super_ProString.m_string.d.d._4_4_,
                          local_68.super_ProString.m_string.d.d._0_4_),2,0x10);
    }
  }
  if ((pPVar3->super_QList<ProString>).d.size != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString
                ((QString *)&local_88,
                 (ProString *)
                 ((long)&(((pPVar3->super_QList<ProString>).d.ptr)->m_string).d.d + lVar6));
      QVar7.m_data = (storage_type *)0x3;
      QVar7.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar7);
      local_a8 = local_68.super_ProString.m_string.d.d._0_4_;
      uStack_a4 = local_68.super_ProString.m_string.d.d._4_4_;
      uStack_a0 = local_68.super_ProString.m_string.d.ptr._0_4_;
      uStack_9c = local_68.super_ProString.m_string.d.ptr._4_4_;
      local_98 = local_68.super_ProString.m_string.d.size;
      QRegularExpression::QRegularExpression(local_90,&local_a8,0);
      QVar8.m_data = (storage_type *)0x0;
      QVar8.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar8);
      pQVar2 = (QArrayData *)
               CONCAT44(local_68.super_ProString.m_string.d.d._4_4_,
                        local_68.super_ProString.m_string.d.d._0_4_);
      QString::replace((QRegularExpression *)&local_88,(QString *)local_90);
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      QRegularExpression::~QRegularExpression(local_90);
      piVar1 = (int *)CONCAT44(uStack_a4,local_a8);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_a4,local_a8),2,0x10);
        }
      }
      if (local_78 != (undefined1 *)0x0) {
        pQVar4 = (QTextStream *)QTextStream::operator<<(t,"-I");
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                  (&local_68,this,&local_88);
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)&local_68);
        QTextStream::operator<<(pQVar4,' ');
        piVar1 = (int *)CONCAT44(local_68.super_ProString.m_string.d.d._4_4_,
                                 local_68.super_ProString.m_string.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)
                       CONCAT44(local_68.super_ProString.m_string.d.d._4_4_,
                                local_68.super_ProString.m_string.d.d._0_4_),2,0x10);
          }
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x30;
    } while (uVar5 < (ulong)(pPVar3->super_QList<ProString>).d.size);
  }
  Qt::endl(t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeIncPart(QTextStream &t)
{
    t << "INCPATH       = ";

    const ProStringList &incs = project->values("INCLUDEPATH");
    for(int i = 0; i < incs.size(); ++i) {
        QString inc = incs.at(i).toQString();
        inc.replace(QRegularExpression("\\\\$"), "");
        if(!inc.isEmpty())
            t << "-I" << escapeFilePath(inc) << ' ';
    }
    t << Qt::endl;
}